

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsBuiltInEngineInterfaceExtensionObject.cpp
# Opt level: O3

void __thiscall
Js::JsBuiltInEngineInterfaceExtensionObject::InitializePrototypes
          (JsBuiltInEngineInterfaceExtensionObject *this,ScriptContext *scriptContext)

{
  Type *addr;
  Type *addr_00;
  JavascriptLibrary *pJVar1;
  PropertyId propertyId;
  JavascriptString *propertyName;
  Var pvVar2;
  DynamicObject *pDVar3;
  JavascriptFunction *pJVar4;
  
  pJVar1 = (scriptContext->super_ScriptContextBase).javascriptLibrary;
  propertyName = JavascriptString::NewWithSz(L"ArrayIterator",scriptContext);
  pDVar3 = (pJVar1->chakraLibraryObject).ptr;
  propertyId = JavascriptOperators::GetPropertyId(propertyName,scriptContext);
  pvVar2 = JavascriptOperators::GetProperty
                     (&pDVar3->super_RecyclableObject,propertyId,scriptContext,
                      (PropertyValueInfo *)0x0);
  pDVar3 = VarTo<Js::DynamicObject>(pvVar2);
  pvVar2 = JavascriptOperators::GetProperty
                     (&pDVar3->super_RecyclableObject,0x124,scriptContext,(PropertyValueInfo *)0x0);
  pDVar3 = VarTo<Js::DynamicObject>(pvVar2);
  addr = &(pJVar1->super_JavascriptLibraryBase).arrayIteratorPrototype;
  Memory::Recycler::WBSetBit((char *)addr);
  (pJVar1->super_JavascriptLibraryBase).arrayIteratorPrototype.ptr = pDVar3;
  Memory::RecyclerWriteBarrierManager::WriteBarrier(addr);
  pvVar2 = JavascriptOperators::GetProperty
                     (&((pJVar1->super_JavascriptLibraryBase).arrayIteratorPrototype.ptr)->
                       super_RecyclableObject,0x107,scriptContext,(PropertyValueInfo *)0x0);
  pJVar4 = VarTo<Js::JavascriptFunction>(pvVar2);
  addr_00 = &(pJVar1->super_JavascriptLibraryBase).arrayIteratorPrototypeBuiltinNextFunction;
  Memory::Recycler::WBSetBit((char *)addr_00);
  (pJVar1->super_JavascriptLibraryBase).arrayIteratorPrototypeBuiltinNextFunction.ptr = pJVar4;
  Memory::RecyclerWriteBarrierManager::WriteBarrier(addr_00);
  return;
}

Assistant:

void JsBuiltInEngineInterfaceExtensionObject::InitializePrototypes(ScriptContext * scriptContext)
    {
        JavascriptLibrary* library = scriptContext->GetLibrary();
        JavascriptString * methodName = JavascriptString::NewWithSz(_u("ArrayIterator"), scriptContext);
        auto arrayIterator = JavascriptOperators::GetProperty(library->GetChakraLib(), JavascriptOperators::GetPropertyId(methodName, scriptContext), scriptContext);
        library->arrayIteratorPrototype = VarTo<DynamicObject>(JavascriptOperators::GetProperty(VarTo<DynamicObject>(arrayIterator), PropertyIds::prototype, scriptContext));
        library->arrayIteratorPrototypeBuiltinNextFunction = VarTo<JavascriptFunction>(JavascriptOperators::GetProperty(library->arrayIteratorPrototype, PropertyIds::next, scriptContext));
    }